

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::getp_getFormFields
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  long lVar1;
  StringRef *body;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  ulong unaff_RBP;
  CVmObjLookupTable *tab;
  bool bVar7;
  TadsHttpRequestHeader *h;
  undefined8 *puVar8;
  char *ct;
  
  if (getp_getFormFields(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getFormFields();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getFormFields::desc);
  if (iVar5 != 0) {
    return 1;
  }
  lVar1 = *(long *)(this->super_CVmObject).ext_;
  if (*(int *)(lVar1 + 0x68) != 0) {
    vVar6 = CVmObjString::create(0,"overflow",8);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar6;
    return 1;
  }
  body = *(StringRef **)(lVar1 + 0x60);
  if (body == (StringRef *)0x0) {
LAB_00206a71:
    retval->typ = VM_NIL;
  }
  else {
    puVar8 = *(undefined8 **)(lVar1 + 0x58);
    bVar7 = true;
    ct = (char *)0x0;
    do {
      iVar5 = stricmp((char *)*puVar8,"content-type");
      if (iVar5 == 0) {
        ct = (char *)puVar8[1];
        break;
      }
      puVar8 = (undefined8 *)puVar8[2];
    } while (puVar8 != (undefined8 *)0x0);
    if (ct != (char *)0x0) {
      iVar5 = memicmp(ct,"application/x-www-form-urlencoded",0x21);
      if (iVar5 == 0) {
        bVar7 = true;
        unaff_RBP = 0;
      }
      else {
        iVar5 = memicmp(ct,"multipart/form-data",0x13);
        if (iVar5 != 0) goto LAB_00206a71;
        unaff_RBP = 1;
        bVar7 = false;
      }
    }
    vVar6 = CVmObjLookupTable::create(0,0x20,0x40);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar6;
    pvVar4 = sp_;
    uVar3 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar4->typ = retval->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    tab = (CVmObjLookupTable *)
          ((long)&G_obj_table_X.pages_[(retval->val).obj >> 0xc]->ptr_ +
          (ulong)(((retval->val).obj & 0xfff) * 0x18));
    if (bVar7) {
      parse_query_params(tab,body->str,2);
    }
    else if ((unaff_RBP & 1) != 0) {
      parse_multipart(tab,body,ct);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getFormFields(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;
    StringRef *body = req->body;

    /* if the body was too large, return 'overflow' */
    if (req->overflow)
    {
        retval->set_obj(CVmObjString::create(vmg_ FALSE, "overflow", 8));
        return TRUE;
    }

    /* if there's no message body, there are no form fields */
    if (body == 0)
    {
        retval->set_nil();
        return TRUE;
    }

    /* find the content type header */
    const char *ct = hdrs->find("content-type");
    int typ;
    if (ct != 0)
    {
        /* check what we have */
        if (memicmp(ct, "application/x-www-form-urlencoded", 33) == 0)
            typ = 0;
        else if (memicmp(ct, "multipart/form-data", 19) == 0)
            typ = 1;
        else
        {
            /* it's not a posted format we recognize - return nil */
            retval->set_nil();
            return TRUE;
        }
    }

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* parse the content type that we found */
    if (typ == 0)
    {
        /* 
         *   URL-encoded form data.  This is the same format as a URL query
         *   string, so we can just apply that parser to the message body. 
         */
        parse_query_params(vmg_ tab, body->get(), ENCMODE_FORM);
    }
    else if (typ == 1)
    {
        /* 
         *   Multipart form-data.  Invoke our generic multipart parser.  
         */
        parse_multipart(vmg_ tab, body, ct);
    }

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}